

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_ClassArray<ON_BrepEdge>::Empty(ON_ClassArray<ON_BrepEdge> *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)this->m_count;
  if (0 < lVar1) {
    lVar2 = lVar1 + 1;
    lVar1 = lVar1 * 0x88;
    do {
      (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                     (&this->m_a[-1].super_ON_CurveProxy.m_real_curve_domain + -2))
                                    ->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar1) + 0x18))
                ((long)&(((ON_CurveProxy *)
                         (&this->m_a[-1].super_ON_CurveProxy.m_real_curve_domain + -2))->
                        super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar1);
      memset((void *)((long)&(((ON_CurveProxy *)
                              (&this->m_a[-1].super_ON_CurveProxy.m_real_curve_domain + -2))->
                             super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                     lVar1),0,0x88);
      ON_BrepEdge::ON_BrepEdge
                ((ON_BrepEdge *)
                 ((long)&(((ON_CurveProxy *)
                          (&this->m_a[-1].super_ON_CurveProxy.m_real_curve_domain + -2))->
                         super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar1))
      ;
      lVar2 = lVar2 + -1;
      lVar1 = lVar1 + -0x88;
    } while (1 < lVar2);
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}